

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_value.cpp
# Opt level: O2

void test_type_conversion(void)

{
  bool bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  int32_t iVar4;
  version vVar5;
  wostream *pwVar6;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar7;
  double dVar8;
  value _l;
  value _r;
  string_view local_c0;
  gc_heap h;
  string_view local_40;
  undefined8 local_30;
  
  mjs::gc_heap::gc_heap(&h,0x200);
  mjs::to_primitive(&_l,(value *)&mjs::value::undefined,undefined);
  mjs::value::value(&_r,(value *)&mjs::value::undefined);
  bVar1 = mjs::operator!=(&_l,&_r);
  if (bVar1) {
    pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
    pwVar6 = std::operator<<(pwVar6," in ");
    pwVar6 = std::operator<<(pwVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                            );
    pwVar6 = std::operator<<(pwVar6,":");
    pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x56);
    pwVar6 = std::operator<<(pwVar6,":\n");
    pwVar6 = std::operator<<(pwVar6,"to_primitive(value::undefined)");
    pwVar6 = std::operator<<(pwVar6," != ");
    pwVar6 = std::operator<<(pwVar6,"value::undefined");
    pwVar6 = std::operator<<(pwVar6,"\n");
    pbVar7 = operator<<(pwVar6,&_l);
    pwVar6 = std::operator<<(pbVar7," != ");
    pbVar7 = operator<<(pwVar6,&_r);
    pwVar6 = std::operator<<(pbVar7,"\n");
    vVar5 = tested_version();
    pbVar7 = mjs::operator<<(pwVar6,vVar5);
    std::operator<<(pbVar7,"\n");
  }
  else {
    mjs::value::~value(&_r);
    mjs::value::~value(&_l);
    mjs::to_primitive(&_l,(value *)&mjs::value::null,undefined);
    mjs::value::value(&_r,(value *)&mjs::value::null);
    bVar1 = mjs::operator!=(&_l,&_r);
    if (bVar1) {
      pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
      pwVar6 = std::operator<<(pwVar6," in ");
      pwVar6 = std::operator<<(pwVar6,
                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                              );
      pwVar6 = std::operator<<(pwVar6,":");
      pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x57);
      pwVar6 = std::operator<<(pwVar6,":\n");
      pwVar6 = std::operator<<(pwVar6,"to_primitive(value::null)");
      pwVar6 = std::operator<<(pwVar6," != ");
      pwVar6 = std::operator<<(pwVar6,"value::null");
      pwVar6 = std::operator<<(pwVar6,"\n");
      pbVar7 = operator<<(pwVar6,&_l);
      pwVar6 = std::operator<<(pbVar7," != ");
      pbVar7 = operator<<(pwVar6,&_r);
      pwVar6 = std::operator<<(pbVar7,"\n");
      vVar5 = tested_version();
      pbVar7 = mjs::operator<<(pwVar6,vVar5);
      std::operator<<(pbVar7,"\n");
    }
    else {
      mjs::value::~value(&_r);
      mjs::value::~value(&_l);
      _r.type_ = boolean;
      _r.field_1.b_ = true;
      mjs::to_primitive(&_l,&_r,undefined);
      mjs::value::~value(&_r);
      _r.type_ = boolean;
      _r.field_1.b_ = true;
      bVar1 = mjs::operator!=(&_l,&_r);
      if (bVar1) {
        pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
        pwVar6 = std::operator<<(pwVar6," in ");
        pwVar6 = std::operator<<(pwVar6,
                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                );
        pwVar6 = std::operator<<(pwVar6,":");
        pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x58);
        pwVar6 = std::operator<<(pwVar6,":\n");
        pwVar6 = std::operator<<(pwVar6,"to_primitive(value{true})");
        pwVar6 = std::operator<<(pwVar6," != ");
        pwVar6 = std::operator<<(pwVar6,"value{true}");
        pwVar6 = std::operator<<(pwVar6,"\n");
        pbVar7 = operator<<(pwVar6,&_l);
        pwVar6 = std::operator<<(pbVar7," != ");
        pbVar7 = operator<<(pwVar6,&_r);
        pwVar6 = std::operator<<(pbVar7,"\n");
        vVar5 = tested_version();
        pbVar7 = mjs::operator<<(pwVar6,vVar5);
        std::operator<<(pbVar7,"\n");
      }
      else {
        mjs::value::~value(&_r);
        mjs::value::~value(&_l);
        _r.type_ = number;
        _r.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)0x4045000000000000;
        mjs::to_primitive(&_l,&_r,undefined);
        mjs::value::~value(&_r);
        _r.type_ = number;
        _r.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)0x4045000000000000;
        bVar1 = mjs::operator!=(&_l,&_r);
        if (bVar1) {
          pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
          pwVar6 = std::operator<<(pwVar6," in ");
          pwVar6 = std::operator<<(pwVar6,
                                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                  );
          pwVar6 = std::operator<<(pwVar6,":");
          pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x59);
          pwVar6 = std::operator<<(pwVar6,":\n");
          pwVar6 = std::operator<<(pwVar6,"to_primitive(value{42.0})");
          pwVar6 = std::operator<<(pwVar6," != ");
          pwVar6 = std::operator<<(pwVar6,"value{42.0}");
          pwVar6 = std::operator<<(pwVar6,"\n");
          pbVar7 = operator<<(pwVar6,&_l);
          pwVar6 = std::operator<<(pbVar7," != ");
          pbVar7 = operator<<(pwVar6,&_r);
          pwVar6 = std::operator<<(pbVar7,"\n");
          vVar5 = tested_version();
          pbVar7 = mjs::operator<<(pwVar6,vVar5);
          std::operator<<(pbVar7,"\n");
        }
        else {
          mjs::value::~value(&_r);
          mjs::value::~value(&_l);
          local_40._M_len = 4;
          local_40._M_str = "test";
          mjs::string::string((string *)&local_c0,&h,&local_40);
          mjs::value::value(&_r,(string *)&local_c0);
          mjs::to_primitive(&_l,&_r,undefined);
          mjs::value::~value(&_r);
          mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c0);
          local_40._M_len = 4;
          local_40._M_str = "test";
          mjs::string::string((string *)&local_c0,&h,&local_40);
          mjs::value::value(&_r,(string *)&local_c0);
          mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_c0);
          bVar1 = mjs::operator!=(&_l,&_r);
          if (bVar1) {
            pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
            pwVar6 = std::operator<<(pwVar6," in ");
            pwVar6 = std::operator<<(pwVar6,
                                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                    );
            pwVar6 = std::operator<<(pwVar6,":");
            pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x5a);
            pwVar6 = std::operator<<(pwVar6,":\n");
            pwVar6 = std::operator<<(pwVar6,"to_primitive((value{string{h, \"test\"}}))");
            pwVar6 = std::operator<<(pwVar6," != ");
            pwVar6 = std::operator<<(pwVar6,"(value{string{h, \"test\"}})");
            pwVar6 = std::operator<<(pwVar6,"\n");
            pbVar7 = operator<<(pwVar6,&_l);
            pwVar6 = std::operator<<(pbVar7," != ");
            pbVar7 = operator<<(pwVar6,&_r);
            pwVar6 = std::operator<<(pbVar7,"\n");
            vVar5 = tested_version();
            pbVar7 = mjs::operator<<(pwVar6,vVar5);
            std::operator<<(pbVar7,"\n");
          }
          else {
            mjs::value::~value(&_r);
            mjs::value::~value(&_l);
            bVar1 = mjs::to_boolean((value *)&mjs::value::undefined);
            if (bVar1) {
              pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
              pwVar6 = std::operator<<(pwVar6," in ");
              pwVar6 = std::operator<<(pwVar6,
                                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                      );
              pwVar6 = std::operator<<(pwVar6,":");
              pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x5d);
              pwVar6 = std::operator<<(pwVar6,":\n");
              pwVar6 = std::operator<<(pwVar6,"!!(!to_boolean(value::undefined))");
              pwVar6 = std::operator<<(pwVar6," != ");
              pwVar6 = std::operator<<(pwVar6,"true");
              pwVar6 = std::operator<<(pwVar6,"\n");
              pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
              pwVar6 = std::operator<<(pwVar6," != ");
              pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
              pwVar6 = std::operator<<(pwVar6,"\n");
              vVar5 = tested_version();
              pbVar7 = mjs::operator<<(pwVar6,vVar5);
              std::operator<<(pbVar7,"\n");
            }
            else {
              bVar1 = mjs::to_boolean((value *)&mjs::value::null);
              if (bVar1) {
                pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
                pwVar6 = std::operator<<(pwVar6," in ");
                pwVar6 = std::operator<<(pwVar6,
                                         "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                        );
                pwVar6 = std::operator<<(pwVar6,":");
                pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x5e);
                pwVar6 = std::operator<<(pwVar6,":\n");
                pwVar6 = std::operator<<(pwVar6,"!!(!to_boolean(value::null))");
                pwVar6 = std::operator<<(pwVar6," != ");
                pwVar6 = std::operator<<(pwVar6,"true");
                pwVar6 = std::operator<<(pwVar6,"\n");
                pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                pwVar6 = std::operator<<(pwVar6," != ");
                pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                pwVar6 = std::operator<<(pwVar6,"\n");
                vVar5 = tested_version();
                pbVar7 = mjs::operator<<(pwVar6,vVar5);
                std::operator<<(pbVar7,"\n");
              }
              else {
                _l.type_ = boolean;
                _l.field_1.n_ = _l.field_1.n_ & 0xffffffffffffff00;
                bVar1 = mjs::to_boolean(&_l);
                mjs::value::~value(&_l);
                if (bVar1) {
                  pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
                  pwVar6 = std::operator<<(pwVar6," in ");
                  pwVar6 = std::operator<<(pwVar6,
                                           "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                          );
                  pwVar6 = std::operator<<(pwVar6,":");
                  pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x5f);
                  pwVar6 = std::operator<<(pwVar6,":\n");
                  pwVar6 = std::operator<<(pwVar6,"!!(!to_boolean(value{false}))");
                  pwVar6 = std::operator<<(pwVar6," != ");
                  pwVar6 = std::operator<<(pwVar6,"true");
                  pwVar6 = std::operator<<(pwVar6,"\n");
                  pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                  pwVar6 = std::operator<<(pwVar6," != ");
                  pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                  pwVar6 = std::operator<<(pwVar6,"\n");
                  vVar5 = tested_version();
                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                  std::operator<<(pbVar7,"\n");
                }
                else {
                  _l.type_ = boolean;
                  _l.field_1.b_ = true;
                  bVar1 = mjs::to_boolean(&_l);
                  mjs::value::~value(&_l);
                  if (bVar1) {
                    _l.type_ = number;
                    _l.field_1.n_ = NAN;
                    bVar1 = mjs::to_boolean(&_l);
                    mjs::value::~value(&_l);
                    if (bVar1) {
                      pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
                      pwVar6 = std::operator<<(pwVar6," in ");
                      pwVar6 = std::operator<<(pwVar6,
                                               "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                              );
                      pwVar6 = std::operator<<(pwVar6,":");
                      pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x61);
                      pwVar6 = std::operator<<(pwVar6,":\n");
                      pwVar6 = std::operator<<(pwVar6,
                                               "!!(!to_boolean(value{(__builtin_nanf (\"\"))}))");
                      pwVar6 = std::operator<<(pwVar6," != ");
                      pwVar6 = std::operator<<(pwVar6,"true");
                      pwVar6 = std::operator<<(pwVar6,"\n");
                      pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                      pwVar6 = std::operator<<(pwVar6," != ");
                      pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                      pwVar6 = std::operator<<(pwVar6,"\n");
                      vVar5 = tested_version();
                      pbVar7 = mjs::operator<<(pwVar6,vVar5);
                      std::operator<<(pbVar7,"\n");
                    }
                    else {
                      _l.type_ = number;
                      _l.field_1.n_ = 0.0;
                      bVar1 = mjs::to_boolean(&_l);
                      mjs::value::~value(&_l);
                      if (bVar1) {
                        pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
                        pwVar6 = std::operator<<(pwVar6," in ");
                        pwVar6 = std::operator<<(pwVar6,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                );
                        pwVar6 = std::operator<<(pwVar6,":");
                        pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x62);
                        pwVar6 = std::operator<<(pwVar6,":\n");
                        pwVar6 = std::operator<<(pwVar6,"!!(!to_boolean(value{0.0}))");
                        pwVar6 = std::operator<<(pwVar6," != ");
                        pwVar6 = std::operator<<(pwVar6,"true");
                        pwVar6 = std::operator<<(pwVar6,"\n");
                        pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                        pwVar6 = std::operator<<(pwVar6," != ");
                        pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                        pwVar6 = std::operator<<(pwVar6,"\n");
                        vVar5 = tested_version();
                        pbVar7 = mjs::operator<<(pwVar6,vVar5);
                        std::operator<<(pbVar7,"\n");
                      }
                      else {
                        _l.type_ = number;
                        _l.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                        heap_ = (gc_heap *)0x4045000000000000;
                        bVar1 = mjs::to_boolean(&_l);
                        mjs::value::~value(&_l);
                        if (bVar1) {
                          local_c0._M_len = 0;
                          local_c0._M_str = "";
                          mjs::string::string((string *)&_r,&h,&local_c0);
                          mjs::value::value(&_l,(string *)&_r);
                          bVar1 = mjs::to_boolean(&_l);
                          mjs::value::~value(&_l);
                          mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&_r)
                          ;
                          if (bVar1) {
                            pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion")
                            ;
                            pwVar6 = std::operator<<(pwVar6," in ");
                            pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                            pwVar6 = std::operator<<(pwVar6,":");
                            pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,100);
                            pwVar6 = std::operator<<(pwVar6,":\n");
                            pwVar6 = std::operator<<(pwVar6,"!!(!to_boolean(value{string{h,\"\"}}))"
                                                    );
                            pwVar6 = std::operator<<(pwVar6," != ");
                            pwVar6 = std::operator<<(pwVar6,"true");
                            pwVar6 = std::operator<<(pwVar6,"\n");
                            pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                            pwVar6 = std::operator<<(pwVar6," != ");
                            pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                            pwVar6 = std::operator<<(pwVar6,"\n");
                            vVar5 = tested_version();
                            pbVar7 = mjs::operator<<(pwVar6,vVar5);
                            std::operator<<(pbVar7,"\n");
                          }
                          else {
                            local_c0._M_len = 4;
                            local_c0._M_str = "test";
                            mjs::string::string((string *)&_r,&h,&local_c0);
                            mjs::value::value(&_l,(string *)&_r);
                            bVar1 = mjs::to_boolean(&_l);
                            mjs::value::~value(&_l);
                            mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                      ((gc_heap_ptr_untyped *)&_r);
                            if (bVar1) {
                              local_40._M_len = 6;
                              local_40._M_str = "Object";
                              mjs::string::string((string *)&local_c0,&h,&local_40);
                              local_30 = 0;
                              mjs::gc_heap::make<mjs::object,mjs::string,decltype(nullptr)>
                                        ((gc_heap *)&_r,(string *)&h,(void **)&local_c0);
                              mjs::value::value(&_l,(object_ptr *)&_r);
                              bVar1 = mjs::to_boolean(&_l);
                              mjs::value::~value(&_l);
                              mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                        ((gc_heap_ptr_untyped *)&_r);
                              mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                        ((gc_heap_ptr_untyped *)&local_c0);
                              if (bVar1) {
                                _l.field_1.n_ = mjs::to_number((value *)&mjs::value::undefined);
                                _l.type_ = number;
                                _r.field_1.n_ = NAN;
                                _r.type_ = _l.type_;
                                bVar1 = mjs::operator!=(&_l,&_r);
                                if (bVar1) {
                                  pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                           "test_type_conversion");
                                  pwVar6 = std::operator<<(pwVar6," in ");
                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                  pwVar6 = std::operator<<(pwVar6,":");
                                  pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x68);
                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                  pwVar6 = std::operator<<(pwVar6,
                                                  "value{to_number(value::undefined)}");
                                  pwVar6 = std::operator<<(pwVar6," != ");
                                  pwVar6 = std::operator<<(pwVar6,"value{NAN}");
                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                  pbVar7 = operator<<(pwVar6,&_l);
                                  pwVar6 = std::operator<<(pbVar7," != ");
                                  pbVar7 = operator<<(pwVar6,&_r);
                                  pwVar6 = std::operator<<(pbVar7,"\n");
                                  vVar5 = tested_version();
                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                  std::operator<<(pbVar7,"\n");
                                }
                                else {
                                  mjs::value::~value(&_r);
                                  mjs::value::~value(&_l);
                                  dVar8 = mjs::to_number((value *)&mjs::value::null);
                                  if ((dVar8 != 0.0) || (NAN(dVar8))) {
                                    pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                             "test_type_conversion");
                                    pwVar6 = std::operator<<(pwVar6," in ");
                                    pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                    pwVar6 = std::operator<<(pwVar6,":");
                                    pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x69);
                                    pwVar6 = std::operator<<(pwVar6,":\n");
                                    pwVar6 = std::operator<<(pwVar6,"to_number(value::null)");
                                    pwVar6 = std::operator<<(pwVar6," != ");
                                    pwVar6 = std::operator<<(pwVar6,"0");
                                    std::operator<<(pwVar6,"\n");
                                    pwVar6 = std::wostream::_M_insert<double>(dVar8);
                                    pwVar6 = std::operator<<(pwVar6," != ");
                                    pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0);
                                    pwVar6 = std::operator<<(pwVar6,"\n");
                                    vVar5 = tested_version();
                                    pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                    std::operator<<(pbVar7,"\n");
                                  }
                                  else {
                                    _l.type_ = boolean;
                                    _l.field_1.n_ = _l.field_1.n_ & 0xffffffffffffff00;
                                    dVar8 = mjs::to_number(&_l);
                                    mjs::value::~value(&_l);
                                    if ((dVar8 != 0.0) || (NAN(dVar8))) {
                                      pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                               "test_type_conversion");
                                      pwVar6 = std::operator<<(pwVar6," in ");
                                      pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                      pwVar6 = std::operator<<(pwVar6,":");
                                      pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x6a);
                                      pwVar6 = std::operator<<(pwVar6,":\n");
                                      pwVar6 = std::operator<<(pwVar6,"to_number(value{false})");
                                      pwVar6 = std::operator<<(pwVar6," != ");
                                      pwVar6 = std::operator<<(pwVar6,"0");
                                      std::operator<<(pwVar6,"\n");
                                      pwVar6 = std::wostream::_M_insert<double>(dVar8);
                                      pwVar6 = std::operator<<(pwVar6," != ");
                                      pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0);
                                      pwVar6 = std::operator<<(pwVar6,"\n");
                                      vVar5 = tested_version();
                                      pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                      std::operator<<(pbVar7,"\n");
                                    }
                                    else {
                                      _l.type_ = boolean;
                                      _l.field_1.b_ = true;
                                      dVar8 = mjs::to_number(&_l);
                                      mjs::value::~value(&_l);
                                      if ((dVar8 != 1.0) || (NAN(dVar8))) {
                                        pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                                 "test_type_conversion");
                                        pwVar6 = std::operator<<(pwVar6," in ");
                                        pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                        pwVar6 = std::operator<<(pwVar6,":");
                                        pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x6b);
                                        pwVar6 = std::operator<<(pwVar6,":\n");
                                        pwVar6 = std::operator<<(pwVar6,"to_number(value{true})");
                                        pwVar6 = std::operator<<(pwVar6," != ");
                                        pwVar6 = std::operator<<(pwVar6,"1");
                                        std::operator<<(pwVar6,"\n");
                                        pwVar6 = std::wostream::_M_insert<double>(dVar8);
                                        pwVar6 = std::operator<<(pwVar6," != ");
                                        pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,1);
                                        pwVar6 = std::operator<<(pwVar6,"\n");
                                        vVar5 = tested_version();
                                        pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                        std::operator<<(pbVar7,"\n");
                                      }
                                      else {
                                        _l.type_ = number;
                                        _l.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.
                                        super_gc_heap_ptr_untyped.heap_ =
                                             (gc_heap *)0x4045000000000000;
                                        dVar8 = mjs::to_number(&_l);
                                        mjs::value::~value(&_l);
                                        if ((dVar8 != 42.0) || (NAN(dVar8))) {
                                          pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                                   "test_type_conversion");
                                          pwVar6 = std::operator<<(pwVar6," in ");
                                          pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                          pwVar6 = std::operator<<(pwVar6,":");
                                          pwVar6 = (wostream *)
                                                   std::wostream::operator<<(pwVar6,0x6c);
                                          pwVar6 = std::operator<<(pwVar6,":\n");
                                          pwVar6 = std::operator<<(pwVar6,"to_number(value{42.0})");
                                          pwVar6 = std::operator<<(pwVar6," != ");
                                          pwVar6 = std::operator<<(pwVar6,"42.0");
                                          std::operator<<(pwVar6,"\n");
                                          pwVar6 = std::wostream::_M_insert<double>(dVar8);
                                          std::operator<<(pwVar6," != ");
                                          pwVar6 = std::wostream::_M_insert<double>(42.0);
                                          pwVar6 = std::operator<<(pwVar6,"\n");
                                          vVar5 = tested_version();
                                          pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                          std::operator<<(pbVar7,"\n");
                                        }
                                        else {
                                          local_c0._M_len = 5;
                                          local_c0._M_str = "42.25";
                                          mjs::string::string((string *)&_r,&h,&local_c0);
                                          mjs::value::value(&_l,(string *)&_r);
                                          dVar8 = mjs::to_number(&_l);
                                          mjs::value::~value(&_l);
                                          mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                    ((gc_heap_ptr_untyped *)&_r);
                                          if ((dVar8 != 42.25) || (NAN(dVar8))) {
                                            pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                                     "test_type_conversion");
                                            pwVar6 = std::operator<<(pwVar6," in ");
                                            pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                            pwVar6 = std::operator<<(pwVar6,":");
                                            pwVar6 = (wostream *)
                                                     std::wostream::operator<<(pwVar6,0x6d);
                                            pwVar6 = std::operator<<(pwVar6,":\n");
                                            pwVar6 = std::operator<<(pwVar6,
                                                  "to_number(value{string{h,\"42.25\"}})");
                                            pwVar6 = std::operator<<(pwVar6," != ");
                                            pwVar6 = std::operator<<(pwVar6,"42.25");
                                            std::operator<<(pwVar6,"\n");
                                            pwVar6 = std::wostream::_M_insert<double>(dVar8);
                                            std::operator<<(pwVar6," != ");
                                            pwVar6 = std::wostream::_M_insert<double>(42.25);
                                            pwVar6 = std::operator<<(pwVar6,"\n");
                                            vVar5 = tested_version();
                                            pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                            std::operator<<(pbVar7,"\n");
                                          }
                                          else {
                                            local_c0._M_len = 4;
                                            local_c0._M_str = "1e80";
                                            mjs::string::string((string *)&_r,&h,&local_c0);
                                            mjs::value::value(&_l,(string *)&_r);
                                            dVar8 = mjs::to_number(&_l);
                                            mjs::value::~value(&_l);
                                            mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                      ((gc_heap_ptr_untyped *)&_r);
                                            if ((dVar8 != 1e+80) || (NAN(dVar8))) {
                                              pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                                       "test_type_conversion");
                                              pwVar6 = std::operator<<(pwVar6," in ");
                                              pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                              pwVar6 = std::operator<<(pwVar6,":");
                                              pwVar6 = (wostream *)
                                                       std::wostream::operator<<(pwVar6,0x6e);
                                              pwVar6 = std::operator<<(pwVar6,":\n");
                                              pwVar6 = std::operator<<(pwVar6,
                                                  "to_number(value{string{h,\"1e80\"}})");
                                              pwVar6 = std::operator<<(pwVar6," != ");
                                              pwVar6 = std::operator<<(pwVar6,"1e80");
                                              std::operator<<(pwVar6,"\n");
                                              pwVar6 = std::wostream::_M_insert<double>(dVar8);
                                              std::operator<<(pwVar6," != ");
                                              pwVar6 = std::wostream::_M_insert<double>(1e+80);
                                              pwVar6 = std::operator<<(pwVar6,"\n");
                                              vVar5 = tested_version();
                                              pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                              std::operator<<(pbVar7,"\n");
                                            }
                                            else {
                                              local_c0._M_len = 3;
                                              local_c0._M_str = "-60";
                                              mjs::string::string((string *)&_r,&h,&local_c0);
                                              mjs::value::value(&_l,(string *)&_r);
                                              dVar8 = mjs::to_number(&_l);
                                              mjs::value::~value(&_l);
                                              mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                        ((gc_heap_ptr_untyped *)&_r);
                                              if ((dVar8 != -60.0) || (NAN(dVar8))) {
                                                pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                                         "test_type_conversion");
                                                pwVar6 = std::operator<<(pwVar6," in ");
                                                pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                pwVar6 = std::operator<<(pwVar6,":");
                                                pwVar6 = (wostream *)
                                                         std::wostream::operator<<(pwVar6,0x6f);
                                                pwVar6 = std::operator<<(pwVar6,":\n");
                                                pwVar6 = std::operator<<(pwVar6,
                                                  "to_number(value{string{h,\"-60\"}})");
                                                pwVar6 = std::operator<<(pwVar6," != ");
                                                pwVar6 = std::operator<<(pwVar6,"-60");
                                                std::operator<<(pwVar6,"\n");
                                                pwVar6 = std::wostream::_M_insert<double>(dVar8);
                                                pwVar6 = std::operator<<(pwVar6," != ");
                                                pwVar6 = (wostream *)
                                                         std::wostream::operator<<(pwVar6,-0x3c);
                                                pwVar6 = std::operator<<(pwVar6,"\n");
                                                vVar5 = tested_version();
                                                pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                std::operator<<(pbVar7,"\n");
                                              }
                                              else {
                                                _l.type_ = number;
                                                _l.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.
                                                super_gc_heap_ptr_untyped.heap_ =
                                                     (gc_heap *)0xc045200000000000;
                                                dVar8 = mjs::to_integer(&_l);
                                                mjs::value::~value(&_l);
                                                if ((dVar8 != -42.0) || (NAN(dVar8))) {
                                                  pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                                           "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x73);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_integer(value{-42.25})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,"-42");
                                                  std::operator<<(pwVar6,"\n");
                                                  pwVar6 = std::wostream::_M_insert<double>(dVar8);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,-0x2a);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                }
                                                else {
                                                  _l.type_ = number;
                                                  _l.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.
                                                  super_gc_heap_ptr_untyped.heap_ =
                                                       (gc_heap *)0x41f0000000000000;
                                                  dVar8 = mjs::to_integer(&_l);
                                                  mjs::value::~value(&_l);
                                                  if ((dVar8 != 4294967296.0) || (NAN(dVar8))) {
                                                    pwVar6 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"test_type_conversion"
                                                                            );
                                                    pwVar6 = std::operator<<(pwVar6," in ");
                                                    pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x74);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_integer(value{1.0*(1ULL<<32)})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,"(1ULL<<32)");
                                                  std::operator<<(pwVar6,"\n");
                                                  pwVar6 = std::wostream::_M_insert<double>(dVar8);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::wostream::
                                                           _M_insert<unsigned_long_long>
                                                                     ((ulonglong)pwVar6);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    uVar3 = mjs::to_uint32(8589934591.0);
                                                    if (uVar3 == 0xffffffff) {
                                                      iVar4 = mjs::to_int32(8589934591.0);
                                                      if (iVar4 == -1) {
                                                        uVar2 = mjs::to_uint16(8589934591.0);
                                                        if (uVar2 == 0xffff) {
                                                          mjs::to_string((mjs *)&_l,&h,
                                                                         (value *)&mjs::value::
                                                                                   undefined);
                                                          local_c0._M_len = 9;
                                                          local_c0._M_str = "undefined";
                                                          mjs::string::string((string *)&_r,&h,
                                                                              &local_c0);
                                                          bVar1 = mjs::operator!=((string *)&_l,
                                                                                  (string *)&_r);
                                                          if (bVar1) {
                                                            pwVar6 = std::operator<<((wostream *)
                                                                                     &std::wcerr,
                                                                                                                                                                          
                                                  "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x7a);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value::undefined)");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"undefined\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_r);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_l);
                                                    mjs::to_string((mjs *)&_l,&h,
                                                                   (value *)&mjs::value::null);
                                                    local_c0._M_len = 4;
                                                    local_c0._M_str = "null";
                                                    mjs::string::string((string *)&_r,&h,&local_c0);
                                                    bVar1 = mjs::operator!=((string *)&_l,
                                                                            (string *)&_r);
                                                    if (bVar1) {
                                                      pwVar6 = std::operator<<((wostream *)
                                                                               &std::wcerr,
                                                                                                                                                              
                                                  "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x7b);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value::null)");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"null\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_r);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_l);
                                                    _l.type_ = boolean;
                                                    _l.field_1.n_ =
                                                         _l.field_1.n_ & 0xffffffffffffff00;
                                                    mjs::to_string((mjs *)&_r,&h,&_l);
                                                    mjs::value::~value(&_l);
                                                    local_c0._M_len = 5;
                                                    local_c0._M_str = "false";
                                                    mjs::string::string((string *)&_l,&h,&local_c0);
                                                    bVar1 = mjs::operator!=((string *)&_r,
                                                                            (string *)&_l);
                                                    if (bVar1) {
                                                      pwVar6 = std::operator<<((wostream *)
                                                                               &std::wcerr,
                                                                                                                                                              
                                                  "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x7c);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value{false})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"false\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_l);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_r);
                                                    _l.type_ = boolean;
                                                    _l.field_1.b_ = true;
                                                    mjs::to_string((mjs *)&_r,&h,&_l);
                                                    mjs::value::~value(&_l);
                                                    local_c0._M_len = 4;
                                                    local_c0._M_str = "true";
                                                    mjs::string::string((string *)&_l,&h,&local_c0);
                                                    bVar1 = mjs::operator!=((string *)&_r,
                                                                            (string *)&_l);
                                                    if (bVar1) {
                                                      pwVar6 = std::operator<<((wostream *)
                                                                               &std::wcerr,
                                                                                                                                                              
                                                  "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x7d);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value{true})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"true\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_l);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_r);
                                                    _l.type_ = number;
                                                    _l.field_1.n_ = NAN;
                                                    mjs::to_string((mjs *)&_r,&h,&_l);
                                                    mjs::value::~value(&_l);
                                                    local_c0._M_len = 3;
                                                    local_c0._M_str = "NaN";
                                                    mjs::string::string((string *)&_l,&h,&local_c0);
                                                    bVar1 = mjs::operator!=((string *)&_r,
                                                                            (string *)&_l);
                                                    if (bVar1) {
                                                      pwVar6 = std::operator<<((wostream *)
                                                                               &std::wcerr,
                                                                                                                                                              
                                                  "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x7e);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value{NAN})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"NaN\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_l);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_r);
                                                    _l.type_ = number;
                                                    _l.field_1.n_ = -0.0;
                                                    mjs::to_string((mjs *)&_r,&h,&_l);
                                                    mjs::value::~value(&_l);
                                                    local_c0._M_len = 1;
                                                    local_c0._M_str = "0";
                                                    mjs::string::string((string *)&_l,&h,&local_c0);
                                                    bVar1 = mjs::operator!=((string *)&_r,
                                                                            (string *)&_l);
                                                    if (bVar1) {
                                                      pwVar6 = std::operator<<((wostream *)
                                                                               &std::wcerr,
                                                                                                                                                              
                                                  "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x7f);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value{-0.0})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"0\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_l);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_r);
                                                    _l.type_ = number;
                                                    _l.field_1.n_ = INFINITY;
                                                    mjs::to_string((mjs *)&_r,&h,&_l);
                                                    mjs::value::~value(&_l);
                                                    local_c0._M_len = 8;
                                                    local_c0._M_str = "Infinity";
                                                    mjs::string::string((string *)&_l,&h,&local_c0);
                                                    bVar1 = mjs::operator!=((string *)&_r,
                                                                            (string *)&_l);
                                                    if (bVar1) {
                                                      pwVar6 = std::operator<<((wostream *)
                                                                               &std::wcerr,
                                                                                                                                                              
                                                  "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x80);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value{+INFINITY})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"Infinity\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_l);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_r);
                                                    _l.type_ = number;
                                                    _l.field_1.n_ = -INFINITY;
                                                    mjs::to_string((mjs *)&_r,&h,&_l);
                                                    mjs::value::~value(&_l);
                                                    local_c0._M_len = 9;
                                                    local_c0._M_str = "-Infinity";
                                                    mjs::string::string((string *)&_l,&h,&local_c0);
                                                    bVar1 = mjs::operator!=((string *)&_r,
                                                                            (string *)&_l);
                                                    if (bVar1) {
                                                      pwVar6 = std::operator<<((wostream *)
                                                                               &std::wcerr,
                                                                                                                                                              
                                                  "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x81);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value{-INFINITY})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"-Infinity\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_l);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_r);
                                                    _l.type_ = number;
                                                    _l.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.
                                                    super_gc_heap_ptr_untyped.heap_ =
                                                         (gc_heap *)0x4045200000000000;
                                                    mjs::to_string((mjs *)&_r,&h,&_l);
                                                    mjs::value::~value(&_l);
                                                    local_c0._M_len = 5;
                                                    local_c0._M_str = "42.25";
                                                    mjs::string::string((string *)&_l,&h,&local_c0);
                                                    bVar1 = mjs::operator!=((string *)&_r,
                                                                            (string *)&_l);
                                                    if (bVar1) {
                                                      pwVar6 = std::operator<<((wostream *)
                                                                               &std::wcerr,
                                                                                                                                                              
                                                  "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x82);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value{42.25})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"42.25\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_l);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_r);
                                                    local_40._M_len = 0;
                                                    local_40._M_str = "";
                                                    mjs::string::string((string *)&local_c0,&h,
                                                                        &local_40);
                                                    mjs::value::value(&_l,(string *)&local_c0);
                                                    mjs::to_string((mjs *)&_r,&h,&_l);
                                                    mjs::value::~value(&_l);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&local_c0);
                                                    local_c0._M_len = 0;
                                                    local_c0._M_str = "";
                                                    mjs::string::string((string *)&_l,&h,&local_c0);
                                                    bVar1 = mjs::operator!=((string *)&_r,
                                                                            (string *)&_l);
                                                    if (bVar1) {
                                                      pwVar6 = std::operator<<((wostream *)
                                                                               &std::wcerr,
                                                                                                                                                              
                                                  "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x83);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value{string{h, \"\"}})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  else {
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_l);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&_r);
                                                    local_40._M_len = 4;
                                                    local_40._M_str = "test";
                                                    mjs::string::string((string *)&local_c0,&h,
                                                                        &local_40);
                                                    mjs::value::value(&_l,(string *)&local_c0);
                                                    mjs::to_string((mjs *)&_r,&h,&_l);
                                                    mjs::value::~value(&_l);
                                                    mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                              ((gc_heap_ptr_untyped *)&local_c0);
                                                    local_c0._M_len = 4;
                                                    local_c0._M_str = "test";
                                                    mjs::string::string((string *)&_l,&h,&local_c0);
                                                    bVar1 = mjs::operator!=((string *)&_r,
                                                                            (string *)&_l);
                                                    if (!bVar1) {
                                                      mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                                ((gc_heap_ptr_untyped *)&_l);
                                                      mjs::gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                                                                ((gc_heap_ptr_untyped *)&_r);
                                                      mjs::gc_heap::garbage_collect(&h);
                                                      if ((int)(((ulong)(h.alloc_context_.next_free_
                                                                        - h.alloc_context_.start_) *
                                                                100) / (ulong)(h.alloc_context_.
                                                                               capacity_ -
                                                                              h.alloc_context_.
                                                                              start_)) == 0) {
                                                        mjs::gc_heap::~gc_heap(&h);
                                                        return;
                                                      }
                                                      __assert_fail("h.use_percentage() == 0",
                                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  ,0x88,"void test_type_conversion()");
                                                  }
                                                  pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                                           "test_type_conversion");
                                                  pwVar6 = std::operator<<(pwVar6," in ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x84);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_string(h, value{string{h, \"test\"}})");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "(string{h, \"test\"})");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_r);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = mjs::operator<<(pwVar6,(string *)&_l);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pwVar6 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"test_type_conversion"
                                                                            );
                                                    pwVar6 = std::operator<<(pwVar6," in ");
                                                    pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x78);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_uint16(0x1\'ffff\'ffff)");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,"0xffff");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,uVar2);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0xffff);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  }
                                                  else {
                                                    pwVar6 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"test_type_conversion"
                                                                            );
                                                    pwVar6 = std::operator<<(pwVar6," in ");
                                                    pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x77);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_int32(0x1\'ffff\'ffff)");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,"-1");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,iVar4);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,-1);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  }
                                                  else {
                                                    pwVar6 = std::operator<<((wostream *)&std::wcerr
                                                                             ,"test_type_conversion"
                                                                            );
                                                    pwVar6 = std::operator<<(pwVar6," in ");
                                                    pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                                  pwVar6 = std::operator<<(pwVar6,":");
                                                  pwVar6 = (wostream *)
                                                           std::wostream::operator<<(pwVar6,0x76);
                                                  pwVar6 = std::operator<<(pwVar6,":\n");
                                                  pwVar6 = std::operator<<(pwVar6,
                                                  "to_uint32(0x1\'ffff\'ffff)");
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::operator<<(pwVar6,"0xffff\'ffff");
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  pwVar6 = std::wostream::_M_insert<unsigned_long>
                                                                     ((ulong)pwVar6);
                                                  pwVar6 = std::operator<<(pwVar6," != ");
                                                  pwVar6 = std::wostream::_M_insert<unsigned_long>
                                                                     ((ulong)pwVar6);
                                                  pwVar6 = std::operator<<(pwVar6,"\n");
                                                  vVar5 = tested_version();
                                                  pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                                  std::operator<<(pbVar7,"\n");
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              else {
                                pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                         "test_type_conversion");
                                pwVar6 = std::operator<<(pwVar6," in ");
                                pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                                pwVar6 = std::operator<<(pwVar6,":");
                                pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x66);
                                pwVar6 = std::operator<<(pwVar6,":\n");
                                pwVar6 = std::operator<<(pwVar6,
                                                  "!!(to_boolean(value{h.make<object>(string{h,\"Object\"}, nullptr)}))"
                                                  );
                                pwVar6 = std::operator<<(pwVar6," != ");
                                pwVar6 = std::operator<<(pwVar6,"true");
                                pwVar6 = std::operator<<(pwVar6,"\n");
                                pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                                pwVar6 = std::operator<<(pwVar6," != ");
                                pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                                pwVar6 = std::operator<<(pwVar6,"\n");
                                vVar5 = tested_version();
                                pbVar7 = mjs::operator<<(pwVar6,vVar5);
                                std::operator<<(pbVar7,"\n");
                              }
                            }
                            else {
                              pwVar6 = std::operator<<((wostream *)&std::wcerr,
                                                       "test_type_conversion");
                              pwVar6 = std::operator<<(pwVar6," in ");
                              pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                              pwVar6 = std::operator<<(pwVar6,":");
                              pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x65);
                              pwVar6 = std::operator<<(pwVar6,":\n");
                              pwVar6 = std::operator<<(pwVar6,
                                                  "!!(to_boolean(value{string{h,\"test\"}}))");
                              pwVar6 = std::operator<<(pwVar6," != ");
                              pwVar6 = std::operator<<(pwVar6,"true");
                              pwVar6 = std::operator<<(pwVar6,"\n");
                              pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                              pwVar6 = std::operator<<(pwVar6," != ");
                              pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                              pwVar6 = std::operator<<(pwVar6,"\n");
                              vVar5 = tested_version();
                              pbVar7 = mjs::operator<<(pwVar6,vVar5);
                              std::operator<<(pbVar7,"\n");
                            }
                          }
                        }
                        else {
                          pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
                          pwVar6 = std::operator<<(pwVar6," in ");
                          pwVar6 = std::operator<<(pwVar6,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                                  );
                          pwVar6 = std::operator<<(pwVar6,":");
                          pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,99);
                          pwVar6 = std::operator<<(pwVar6,":\n");
                          pwVar6 = std::operator<<(pwVar6,"!!(to_boolean(value{42.0}))");
                          pwVar6 = std::operator<<(pwVar6," != ");
                          pwVar6 = std::operator<<(pwVar6,"true");
                          pwVar6 = std::operator<<(pwVar6,"\n");
                          pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                          pwVar6 = std::operator<<(pwVar6," != ");
                          pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                          pwVar6 = std::operator<<(pwVar6,"\n");
                          vVar5 = tested_version();
                          pbVar7 = mjs::operator<<(pwVar6,vVar5);
                          std::operator<<(pbVar7,"\n");
                        }
                      }
                    }
                  }
                  else {
                    pwVar6 = std::operator<<((wostream *)&std::wcerr,"test_type_conversion");
                    pwVar6 = std::operator<<(pwVar6," in ");
                    pwVar6 = std::operator<<(pwVar6,
                                             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_value.cpp"
                                            );
                    pwVar6 = std::operator<<(pwVar6,":");
                    pwVar6 = (wostream *)std::wostream::operator<<(pwVar6,0x60);
                    pwVar6 = std::operator<<(pwVar6,":\n");
                    pwVar6 = std::operator<<(pwVar6,"!!(to_boolean(value{true}))");
                    pwVar6 = std::operator<<(pwVar6," != ");
                    pwVar6 = std::operator<<(pwVar6,"true");
                    pwVar6 = std::operator<<(pwVar6,"\n");
                    pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                    pwVar6 = std::operator<<(pwVar6," != ");
                    pwVar6 = std::wostream::_M_insert<bool>(SUB81(pwVar6,0));
                    pwVar6 = std::operator<<(pwVar6,"\n");
                    vVar5 = tested_version();
                    pbVar7 = mjs::operator<<(pwVar6,vVar5);
                    std::operator<<(pbVar7,"\n");
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  abort();
}

Assistant:

void test_type_conversion() {
    gc_heap h{1<<9};
    // TODO: to_primitive hint
    REQUIRE_EQ(to_primitive(value::undefined), value::undefined);
    REQUIRE_EQ(to_primitive(value::null), value::null);
    REQUIRE_EQ(to_primitive(value{true}), value{true});
    REQUIRE_EQ(to_primitive(value{42.0}), value{42.0});
    REQUIRE_EQ(to_primitive((value{string{h, "test"}})), (value{string{h, "test"}}));
    // TODO: Object

    REQUIRE(!to_boolean(value::undefined));
    REQUIRE(!to_boolean(value::null));
    REQUIRE(!to_boolean(value{false}));
    REQUIRE(to_boolean(value{true}));
    REQUIRE(!to_boolean(value{NAN}));
    REQUIRE(!to_boolean(value{0.0}));
    REQUIRE(to_boolean(value{42.0}));
    REQUIRE(!to_boolean(value{string{h,""}}));
    REQUIRE(to_boolean(value{string{h,"test"}}));
    REQUIRE(to_boolean(value{h.make<object>(string{h,"Object"}, nullptr)}));

    REQUIRE_EQ(value{to_number(value::undefined)}, value{NAN});
    REQUIRE_EQ(to_number(value::null), 0);
    REQUIRE_EQ(to_number(value{false}), 0);
    REQUIRE_EQ(to_number(value{true}), 1);
    REQUIRE_EQ(to_number(value{42.0}), 42.0);
    REQUIRE_EQ(to_number(value{string{h,"42.25"}}), 42.25);
    REQUIRE_EQ(to_number(value{string{h,"1e80"}}), 1e80);
    REQUIRE_EQ(to_number(value{string{h,"-60"}}), -60);
    // TODO: Object


    REQUIRE_EQ(to_integer(value{-42.25}), -42);
    REQUIRE_EQ(to_integer(value{1.0*(1ULL<<32)}), (1ULL<<32));

    REQUIRE_EQ(to_uint32(0x1'ffff'ffff), 0xffff'ffff);
    REQUIRE_EQ(to_int32(0x1'ffff'ffff), -1);
    REQUIRE_EQ(to_uint16(0x1'ffff'ffff), 0xffff);

    REQUIRE_EQ(to_string(h, value::undefined), (string{h, "undefined"}));
    REQUIRE_EQ(to_string(h, value::null), (string{h, "null"}));
    REQUIRE_EQ(to_string(h, value{false}), (string{h, "false"}));
    REQUIRE_EQ(to_string(h, value{true}), (string{h, "true"}));
    REQUIRE_EQ(to_string(h, value{NAN}), (string{h, "NaN"}));
    REQUIRE_EQ(to_string(h, value{-0.0}), (string{h, "0"}));
    REQUIRE_EQ(to_string(h, value{+INFINITY}), (string{h, "Infinity"}));
    REQUIRE_EQ(to_string(h, value{-INFINITY}), (string{h, "-Infinity"}));
    REQUIRE_EQ(to_string(h, value{42.25}), (string{h, "42.25"}));
    REQUIRE_EQ(to_string(h, value{string{h, ""}}), (string{h, ""}));
    REQUIRE_EQ(to_string(h, value{string{h, "test"}}), (string{h, "test"}));
    // TODO: Object

    h.garbage_collect();
    assert(h.use_percentage() == 0);
}